

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaQbf.c
# Opt level: O1

Vec_Int_t *
Gia_GenCreateMuxes(Gia_Man_t *p,Gia_Man_t *pNew,Vec_Int_t *vFlops,int nLutNum,int nLutSize,
                  Vec_Int_t *vParLits,int fUseRi)

{
  int iVar1;
  Vec_Int_t *p_00;
  int *piVar2;
  ulong uVar3;
  long lVar4;
  Vec_Int_t *pVVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  int pCtrl [16];
  uint local_78 [18];
  
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar1 = 0x10;
  if (0xe < nLutNum - 1U) {
    iVar1 = nLutNum;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar1;
  if (iVar1 == 0) {
    piVar2 = (int *)0x0;
  }
  else {
    piVar2 = (int *)malloc((long)iVar1 << 2);
  }
  p_00->pArray = piVar2;
  if (vFlops->nSize != nLutSize * nLutNum) {
    __assert_fail("Vec_IntSize(vFlops) == nLutNum * nLutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaQbf.c"
                  ,0x77,
                  "Vec_Int_t *Gia_GenCreateMuxes(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int, int, Vec_Int_t *, int)"
                 );
  }
  if (0 < nLutNum) {
    uVar9 = (ulong)(uint)nLutSize;
    lVar8 = 0;
    lVar4 = 0;
    uVar7 = 0;
    do {
      if (0 < nLutSize) {
        uVar3 = 0;
        do {
          if (((int)lVar8 < 0) || (vFlops->nSize <= (int)uVar3 + (int)lVar8)) {
LAB_0078ac4b:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar1 = *(int *)((long)vFlops->pArray + uVar3 * 4 + lVar4);
          if ((iVar1 < 0) || (p->nRegs <= iVar1)) {
            __assert_fail("iFlop >= 0 && iFlop < Gia_ManRegNum(p)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaQbf.c"
                          ,0x7d,
                          "Vec_Int_t *Gia_GenCreateMuxes(Gia_Man_t *, Gia_Man_t *, Vec_Int_t *, int, int, Vec_Int_t *, int)"
                         );
          }
          if (fUseRi == 0) {
            pVVar5 = p->vCis;
          }
          else {
            pVVar5 = p->vCos;
          }
          uVar6 = (pVVar5->nSize - p->nRegs) + iVar1;
          if (((int)uVar6 < 0) || (pVVar5->nSize <= (int)uVar6)) goto LAB_0078ac4b;
          uVar6 = pVVar5->pArray[uVar6];
          if (((int)uVar6 < 0) || (p->nObjs <= (int)uVar6)) {
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          local_78[uVar3] = p->pObjs[uVar6].Value;
          uVar3 = uVar3 + 1;
        } while (uVar9 != uVar3);
      }
      iVar1 = Gia_GenCreateMux_rec
                        (pNew,(int *)local_78,nLutSize,vParLits,
                         (int)uVar7 << ((byte)nLutSize & 0x1f));
      Vec_IntPush(p_00,iVar1);
      uVar7 = uVar7 + 1;
      lVar8 = lVar8 + uVar9;
      lVar4 = lVar4 + uVar9 * 4;
    } while (uVar7 != (uint)nLutNum);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Gia_GenCreateMuxes( Gia_Man_t * p, Gia_Man_t * pNew, Vec_Int_t * vFlops, int nLutNum, int nLutSize, Vec_Int_t * vParLits, int fUseRi )
{
    Vec_Int_t * vLits = Vec_IntAlloc( nLutNum );
    int i, k, iMux, iFlop, pCtrl[16];
    // add MUXes for each group of flops
    assert( Vec_IntSize(vFlops) == nLutNum * nLutSize );
    for ( i = 0; i < nLutNum; i++ )
    {
        for ( k = 0; k < nLutSize; k++ )
        {
            iFlop = Vec_IntEntry(vFlops, i * nLutSize + k);
            assert( iFlop >= 0 && iFlop < Gia_ManRegNum(p) );
            if ( fUseRi )
                pCtrl[k] = Gia_ManRi(p, iFlop)->Value;
            else
                pCtrl[k] = Gia_ManRo(p, iFlop)->Value;
        }
        iMux = Gia_GenCreateMux_rec( pNew, pCtrl, nLutSize, vParLits, i * (1 << nLutSize) );
        Vec_IntPush( vLits, iMux );
    }
    return vLits;
}